

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pool.cpp
# Opt level: O2

int __thiscall Mempool::get_list_size_byte(Mempool *this,MEM_CAP index)

{
  iterator iVar1;
  mapped_type *ppCVar2;
  mapped_type pCVar3;
  int iVar4;
  MEM_CAP local_20;
  MEM_CAP local_1c;
  
  std::mutex::lock(&this->mp_mutex);
  local_1c = index;
  iVar1 = std::
          _Hashtable<int,_std::pair<const_int,_Chunk_*>,_std::allocator<std::pair<const_int,_Chunk_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<int,_std::pair<const_int,_Chunk_*>,_std::allocator<std::pair<const_int,_Chunk_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this,(key_type *)&local_1c);
  if (iVar1.super__Node_iterator_base<std::pair<const_int,_Chunk_*>,_false>._M_cur !=
      (__node_type *)0x0) {
    local_20 = index;
    ppCVar2 = std::__detail::
              _Map_base<int,_std::pair<const_int,_Chunk_*>,_std::allocator<std::pair<const_int,_Chunk_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<int,_std::pair<const_int,_Chunk_*>,_std::allocator<std::pair<const_int,_Chunk_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this,(key_type *)&local_20);
    iVar4 = 0;
    for (pCVar3 = *ppCVar2; pCVar3 != (mapped_type)0x0; pCVar3 = pCVar3->next) {
      iVar4 = iVar4 + pCVar3->capacity;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mp_mutex);
    return iVar4;
  }
  __assert_fail("mp_pool.find(index) != mp_pool.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/memory/mem_pool.cpp"
                ,0x62,"int Mempool::get_list_size_byte(MEM_CAP)");
}

Assistant:

int Mempool::get_list_size_byte(MEM_CAP index)
{
    int size = 0;
    lock_guard<mutex> lck(mp_mutex);
    assert(mp_pool.find(index) != mp_pool.end());
    Chunk *node = mp_pool[index];

    while(node)
    {
        size += node->capacity;
        node = node->next;
    } 

    return size;
}